

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void value_count_suite::count_boolean(void)

{
  undefined4 local_3ec;
  basic_variable<std::allocator<char>_> local_3e8;
  size_type local_3b8;
  undefined4 local_3ac;
  basic_variable<std::allocator<char>_> local_3a8;
  size_type local_378;
  undefined4 local_36c;
  basic_variable<std::allocator<char>_> local_368;
  size_type local_338;
  undefined4 local_32c;
  size_type local_328;
  undefined4 local_31c;
  basic_variable<std::allocator<char>_> local_318;
  size_type local_2e8;
  undefined4 local_2dc;
  size_type local_2d8;
  undefined4 local_2cc;
  basic_variable<std::allocator<char>_> local_2c8;
  size_type local_298;
  undefined4 local_28c;
  size_type local_288;
  undefined4 local_27c;
  basic_variable<std::allocator<char>_> local_278;
  size_type local_248;
  undefined4 local_23c;
  size_type local_238;
  undefined4 local_22c;
  basic_variable<std::allocator<char>_> local_228;
  size_type local_1f0;
  undefined4 local_1e4;
  double local_1e0;
  size_type local_1d8;
  undefined4 local_1cc;
  basic_variable<std::allocator<char>_> local_1c8;
  size_type local_190 [2];
  undefined4 local_180;
  int local_17c;
  size_type local_178;
  undefined4 local_16c;
  basic_variable<std::allocator<char>_> local_168;
  size_type local_130 [2];
  undefined4 local_120;
  bool local_119;
  size_type local_118;
  undefined4 local_10c;
  basic_variable<std::allocator<char>_> local_108;
  size_type local_d0 [2];
  undefined4 local_c0;
  bool local_b9;
  size_type local_b8;
  undefined4 local_ac;
  basic_variable<std::allocator<char>_> local_a8;
  size_type local_70 [2];
  undefined4 local_60 [5];
  nullable local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,true);
  local_4c = null;
  local_48[0] = trial::dynamic::value::count<std::allocator<char>,trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_38,&local_4c);
  local_60[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, null)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x6a,"void value_count_suite::count_boolean()",local_48,local_60);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8);
  local_70[0] = trial::dynamic::value::
                count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                          ((basic_variable<std::allocator<char>_> *)local_38,&local_a8);
  local_ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x6b,"void value_count_suite::count_boolean()",local_70,&local_ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a8);
  local_b9 = true;
  local_b8 = trial::dynamic::value::count<std::allocator<char>,bool>
                       ((basic_variable<std::allocator<char>_> *)local_38,&local_b9);
  local_c0 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, true)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x6c,"void value_count_suite::count_boolean()",&local_b8,&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_108,true);
  local_d0[0] = trial::dynamic::value::
                count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                          ((basic_variable<std::allocator<char>_> *)local_38,&local_108);
  local_10c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(true))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x6d,"void value_count_suite::count_boolean()",local_d0,&local_10c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_108);
  local_119 = false;
  local_118 = trial::dynamic::value::count<std::allocator<char>,bool>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_119);
  local_120 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, false)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x6e,"void value_count_suite::count_boolean()",&local_118,&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_168,false);
  local_130[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_38,&local_168);
  local_16c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(false))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x6f,"void value_count_suite::count_boolean()",local_130,&local_16c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_168);
  local_17c = 2;
  local_178 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_17c);
  local_180 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 2)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x70,"void value_count_suite::count_boolean()",&local_178,&local_180);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_1c8,2);
  local_190[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_38,&local_1c8);
  local_1cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(2))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x71,"void value_count_suite::count_boolean()",local_190,&local_1cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  local_1e0 = 3.0;
  local_1d8 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_1e0);
  local_1e4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 3.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x72,"void value_count_suite::count_boolean()",&local_1d8,&local_1e4);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_228,3.0);
  local_1f0 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_228);
  local_22c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(3.0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x73,"void value_count_suite::count_boolean()",&local_1f0,&local_22c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_228);
  local_238 = trial::dynamic::value::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,(char (*) [6])"alpha");
  local_23c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x74,"void value_count_suite::count_boolean()",&local_238,&local_23c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278,"alpha");
  local_248 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_278);
  local_27c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x75,"void value_count_suite::count_boolean()",&local_248,&local_27c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  local_288 = trial::dynamic::value::count<std::allocator<char>,wchar_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,(wchar_t (*) [6])L"alpha"
                        );
  local_28c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, L\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x76,"void value_count_suite::count_boolean()",&local_288,&local_28c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2c8,L"alpha");
  local_298 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_2c8);
  local_2cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(L\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x77,"void value_count_suite::count_boolean()",&local_298,&local_2cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2c8);
  local_2d8 = trial::dynamic::value::count<std::allocator<char>,char16_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,
                         (char16_t (*) [6])L"alpha");
  local_2dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, u\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x78,"void value_count_suite::count_boolean()",&local_2d8,&local_2dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,L"alpha");
  local_2e8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_318);
  local_31c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(u\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x79,"void value_count_suite::count_boolean()",&local_2e8,&local_31c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  local_328 = trial::dynamic::value::count<std::allocator<char>,char32_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,
                         (char32_t (*) [6])L"alpha");
  local_32c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, U\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x7a,"void value_count_suite::count_boolean()",&local_328,&local_32c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_368,L"alpha");
  local_338 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_368);
  local_36c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(U\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x7b,"void value_count_suite::count_boolean()",&local_338,&local_36c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_368);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_378 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_3a8);
  local_3ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, array::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x7c,"void value_count_suite::count_boolean()",&local_378,&local_3ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3a8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_3b8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_3e8);
  local_3ec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, map::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x7d,"void value_count_suite::count_boolean()",&local_3b8,&local_3ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void count_boolean()
{
    variable data(true);

    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, null), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable()), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, true), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(true)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, false), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(false)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 2), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(2)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 3.0), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(3.0)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, L"alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(L"alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, u"alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(u"alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, U"alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(U"alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, array::make()), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, map::make()), 0);
}